

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::doSetObjectName(QObject *this,QString *name)

{
  QObjectData *pQVar1;
  _func_int *p_Var2;
  bool bVar3;
  _func_int **pp_Var4;
  QStringView rhs;
  QStringView lhs;
  
  pQVar1 = (this->d_ptr).d;
  pp_Var4 = pQVar1[1]._vptr_QObjectData;
  if (pp_Var4 == (_func_int **)0x0) {
    pp_Var4 = (_func_int **)operator_new(0x80);
    *pp_Var4 = (_func_int *)0x0;
    pp_Var4[1] = (_func_int *)0x0;
    pp_Var4[2] = (_func_int *)0x0;
    pp_Var4[3] = (_func_int *)0x0;
    pp_Var4[4] = (_func_int *)0x0;
    pp_Var4[5] = (_func_int *)0x0;
    pp_Var4[6] = (_func_int *)0x0;
    pp_Var4[7] = (_func_int *)0x0;
    pp_Var4[8] = (_func_int *)0x0;
    pp_Var4[9] = (_func_int *)0x0;
    pp_Var4[10] = (_func_int *)0x0;
    pp_Var4[0xb] = (_func_int *)0x0;
    pp_Var4[0xc] = (_func_int *)0x0;
    pp_Var4[0xd] = (_func_int *)0x0;
    pp_Var4[0xe] = (_func_int *)0x0;
    pp_Var4[0xf] = (_func_int *)pQVar1;
    pQVar1[1]._vptr_QObjectData = pp_Var4;
  }
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::removeBindingUnlessInWrapper
            ((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
              *)(pp_Var4 + 0xc));
  pp_Var4 = pQVar1[1]._vptr_QObjectData;
  p_Var2 = pp_Var4[0xe];
  if (p_Var2 == (_func_int *)(name->d).size) {
    rhs.m_data = (name->d).ptr;
    rhs.m_size = (qsizetype)p_Var2;
    lhs.m_data = (storage_type_conflict *)pp_Var4[0xd];
    lhs.m_size = (qsizetype)p_Var2;
    bVar3 = QtPrivate::equalStrings(lhs,rhs);
    if (bVar3) {
      return;
    }
  }
  QString::operator=((QString *)(pp_Var4 + 0xc),name);
  QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
  ::notify((QObjectCompatProperty<QObjectPrivate::ExtraData,_QString,_&QObjectPrivate::ExtraData::_qt_property_objectName_offset,_&QObjectPrivate::ExtraData::setObjectNameForwarder,_&QObjectPrivate::ExtraData::nameChangedForwarder,_nullptr>
            *)(pQVar1[1]._vptr_QObjectData + 0xc));
  return;
}

Assistant:

void QObject::doSetObjectName(const QString &name)
{
    Q_D(QObject);

    d->ensureExtraData();

    d->extraData->objectName.removeBindingUnlessInWrapper();

    if (d->extraData->objectName.valueBypassingBindings() != name) {
        d->extraData->objectName.setValueBypassingBindings(name);
        d->extraData->objectName.notify(); // also emits a signal
    }
}